

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk_info.cpp
# Opt level: O3

idx_t __thiscall
duckdb::ChunkVectorInfo::TemplatedGetSelVector<duckdb::CommittedVersionOperator>
          (ChunkVectorInfo *this,transaction_t start_time,transaction_t transaction_id,
          SelectionVector *sel_vector,idx_t max_count)

{
  sel_t *psVar1;
  undefined1 auVar2 [16];
  idx_t iVar3;
  ulong uVar4;
  idx_t iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  long lVar8;
  
  auVar2 = _DAT_01d8a390;
  if (this->same_inserted_id == true) {
    if (this->any_deleted == false) {
      return max_count;
    }
    if (max_count != 0) {
      psVar1 = sel_vector->sel_vector;
      iVar5 = 0;
      iVar3 = 0;
      do {
        uVar4 = this->deleted[iVar5];
        if ((start_time <= uVar4 && uVar4 < 0x4000000000000060) || (uVar4 == 0xfffffffffffffffe)) {
          psVar1[iVar3] = (sel_t)iVar5;
          iVar3 = iVar3 + 1;
        }
        iVar5 = iVar5 + 1;
      } while (max_count != iVar5);
      return iVar3;
    }
  }
  else if (this->any_deleted == false) {
    if (max_count != 0) {
      psVar1 = sel_vector->sel_vector;
      lVar8 = max_count - 1;
      auVar6._8_4_ = (int)lVar8;
      auVar6._0_8_ = lVar8;
      auVar6._12_4_ = (int)((ulong)lVar8 >> 0x20);
      uVar4 = 0;
      auVar6 = auVar6 ^ _DAT_01d8a390;
      auVar7 = _DAT_01d8a380;
      do {
        auVar9 = auVar7 ^ auVar2;
        if ((bool)(~(auVar9._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar9._0_4_ ||
                    auVar6._4_4_ < auVar9._4_4_) & 1)) {
          psVar1[uVar4] = (sel_t)uVar4;
        }
        if ((auVar9._12_4_ != auVar6._12_4_ || auVar9._8_4_ <= auVar6._8_4_) &&
            auVar9._12_4_ <= auVar6._12_4_) {
          psVar1[uVar4 + 1] = (sel_t)uVar4 + 1;
        }
        uVar4 = uVar4 + 2;
        lVar8 = auVar7._8_8_;
        auVar7._0_8_ = auVar7._0_8_ + 2;
        auVar7._8_8_ = lVar8 + 2;
      } while ((max_count + 1 & 0xfffffffffffffffe) != uVar4);
      return max_count;
    }
  }
  else if (max_count != 0) {
    psVar1 = sel_vector->sel_vector;
    iVar5 = 0;
    iVar3 = 0;
    do {
      uVar4 = this->deleted[iVar5];
      if ((start_time <= uVar4 && uVar4 < 0x4000000000000060) || (uVar4 == 0xfffffffffffffffe)) {
        psVar1[iVar3] = (sel_t)iVar5;
        iVar3 = iVar3 + 1;
      }
      iVar5 = iVar5 + 1;
    } while (max_count != iVar5);
    return iVar3;
  }
  return 0;
}

Assistant:

idx_t ChunkVectorInfo::TemplatedGetSelVector(transaction_t start_time, transaction_t transaction_id,
                                             SelectionVector &sel_vector, idx_t max_count) const {
	idx_t count = 0;
	if (same_inserted_id && !any_deleted) {
		// all tuples have the same inserted id: and no tuples were deleted
		if (OP::UseInsertedVersion(start_time, transaction_id, insert_id)) {
			return max_count;
		} else {
			return 0;
		}
	} else if (same_inserted_id) {
		if (!OP::UseInsertedVersion(start_time, transaction_id, insert_id)) {
			return 0;
		}
		// have to check deleted flag
		for (idx_t i = 0; i < max_count; i++) {
			if (OP::UseDeletedVersion(start_time, transaction_id, deleted[i])) {
				sel_vector.set_index(count++, i);
			}
		}
	} else if (!any_deleted) {
		// have to check inserted flag
		for (idx_t i = 0; i < max_count; i++) {
			if (OP::UseInsertedVersion(start_time, transaction_id, inserted[i])) {
				sel_vector.set_index(count++, i);
			}
		}
	} else {
		// have to check both flags
		for (idx_t i = 0; i < max_count; i++) {
			if (OP::UseInsertedVersion(start_time, transaction_id, inserted[i]) &&
			    OP::UseDeletedVersion(start_time, transaction_id, deleted[i])) {
				sel_vector.set_index(count++, i);
			}
		}
	}
	return count;
}